

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O0

char * gl4cts::apiToTestName(API api)

{
  char *pcStack_10;
  API api_local;
  
  if (api == API_GL_45core) {
    pcStack_10 = "texture_barrier";
  }
  else if (api == API_GL_ARB_texture_barrier) {
    pcStack_10 = "texture_barrier_ARB";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* apiToTestName(TextureBarrierTests::API api)
{
	switch (api)
	{
	case TextureBarrierTests::API_GL_45core:
		return "texture_barrier";
	case TextureBarrierTests::API_GL_ARB_texture_barrier:
		return "texture_barrier_ARB";
	}
	DE_ASSERT(0);
	return "";
}